

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Heap2Local.cpp
# Opt level: O0

void __thiscall
wasm::anon_unknown_22::Struct2Local::visitLocalGet(Struct2Local *this,LocalGet *curr)

{
  ParentChildInteraction PVar1;
  HeapType type;
  Expression *expression;
  LocalGet *curr_local;
  Struct2Local *this_local;
  
  PVar1 = EscapeAnalyzer::getInteraction(this->analyzer,(Expression *)curr);
  if (PVar1 != None) {
    type = wasm::Type::getHeapType
                     (&(curr->super_SpecificExpression<(wasm::Expression::Id)8>).super_Expression.
                       type);
    expression = (Expression *)Builder::makeRefNull(&this->builder,type);
    replaceCurrent(this,expression);
  }
  return;
}

Assistant:

void visitLocalGet(LocalGet* curr) {
    if (analyzer.getInteraction(curr) == ParentChildInteraction::None) {
      return;
    }

    // Uses of this get will drop it, so the value does not matter. Replace it
    // with something else, which avoids issues with non-nullability (when
    // non-nullable locals are enabled), which could happen like this:
    //
    //   (local $x (ref $foo))
    //   (local.set $x ..)
    //   (.. (local.get $x))
    //
    // If we remove the set but not the get then the get would appear to read
    // the default value of a non-nullable local, which is not allowed.
    //
    // For simplicity, replace the get with a null. We anyhow have null types
    // in the places where our allocation was earlier, see notes on
    // visitBlock, and so using a null here adds no extra complexity.
    replaceCurrent(builder.makeRefNull(curr->type.getHeapType()));
  }